

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void minverse(double *A,int N,int *ipiv,double *inv)

{
  size_t __size;
  double *b;
  double *x;
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  double *local_40;
  
  __size = (long)N * 8;
  b = (double *)malloc(__size);
  x = (double *)malloc(__size);
  uVar1 = 0;
  uVar3 = 0;
  if (0 < N) {
    uVar3 = (ulong)(uint)N;
  }
  for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    b[uVar1] = 0.0;
    x[uVar1] = 0.0;
  }
  local_40 = inv;
  for (uVar1 = 0; uVar1 != uVar3; uVar1 = uVar1 + 1) {
    b[uVar1] = 1.0;
    linsolve(A,N,b,ipiv,x);
    pdVar2 = local_40;
    for (uVar4 = 0; (uint)N != uVar4; uVar4 = uVar4 + 1) {
      *pdVar2 = x[uVar4];
      pdVar2 = pdVar2 + N;
    }
    b[uVar1] = 0.0;
    local_40 = local_40 + 1;
  }
  free(x);
  free(b);
  return;
}

Assistant:

void minverse(double *A,int N,int *ipiv,double *inv) {
	int i,j,stride;
	double *col,*x;
	
	col = (double*) malloc(sizeof(double) * N);
	x = (double*) malloc(sizeof(double) * N);
	
	for (i = 0; i < N; ++i) {
		col[i] = 0.;
		x[i] = 0.;
	}
	
	for (i = 0; i < N; ++i) {
		col[i] = 1.;
		linsolve(A,N,col,ipiv,x);
		stride = i;
		for(j = 0; j < N;++j) {
			inv[stride] = x[j];
			stride+= N;
		}
		col[i] = 0.;
	}
		
	free(x);
	free(col);
}